

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

void Ifn_NtkParseConstraints(char *pStr,Ifn_Ntk_t *p)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int local_20;
  int local_1c;
  int k;
  int i;
  Ifn_Ntk_t *p_local;
  char *pStr_local;
  
  p->nConstr = 0;
  local_1c = 0;
  do {
    if (p->nInps <= local_1c) {
      return;
    }
    for (local_20 = 0; pStr[local_20] != '\0'; local_20 = local_20 + 1) {
      if (((int)pStr[local_20] == local_1c + 0x41) && (pStr[local_20 + -1] == ';')) {
        if (0x78 < p->nConstr) {
          __assert_fail("p->nConstr < IFN_INS*IFN_INS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                        ,0x1b0,"void Ifn_NtkParseConstraints(char *, Ifn_Ntk_t *)");
        }
        cVar1 = pStr[local_20];
        cVar2 = pStr[local_20 + 1];
        iVar3 = p->nConstr;
        p->nConstr = iVar3 + 1;
        p->pConstr[iVar3] = (cVar1 + -0x41) * 0x10000 | (int)cVar2 - 0x41U;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void Ifn_NtkParseConstraints( char * pStr, Ifn_Ntk_t * p )
{
    int i, k;
    // parse constraints
    p->nConstr = 0;
    for ( i = 0; i < p->nInps; i++ )
        for ( k = 0; pStr[k]; k++ )
            if ( pStr[k] == 'A' + i && pStr[k-1] == ';' )
            {
                assert( p->nConstr < IFN_INS*IFN_INS );
                p->pConstr[p->nConstr++] = ((int)(pStr[k] - 'A') << 16) | (int)(pStr[k+1] - 'A');
//                printf( "Added constraint (%c < %c)\n", pStr[k], pStr[k+1] );
            }
//    if ( p->nConstr )
//        printf( "Total constraints = %d\n", p->nConstr );
}